

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowImpl.h
# Opt level: O3

void __thiscall FlowImpl::~FlowImpl(FlowImpl *this)

{
  *(code **)this = FlowImpl::clearSource;
  if (*(FlowImpl **)(this + 0x18) != this + 0x28) {
    operator_delete(*(FlowImpl **)(this + 0x18),*(long *)(this + 0x28) + 1);
    return;
  }
  return;
}

Assistant:

~FlowImpl() override = default;